

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_handshake(ptls_t *tls,ptls_buffer_t *_sendbuf,void *input,size_t *inlen,
                  ptls_handshake_properties_t *properties)

{
  void *pvVar1;
  size_t sVar2;
  uint8_t *__ptr;
  uint8_t description;
  uint uVar3;
  int iVar4;
  size_t consumed;
  st_ptls_record_message_emitter_t emitter;
  size_t local_90;
  ptls_buffer_t local_88;
  size_t *local_68;
  ptls_message_emitter_t local_60;
  undefined8 local_38;
  
  if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
    __assert_fail("tls->state < PTLS_STATE_POST_HANDSHAKE_MIN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x12e1,
                  "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  local_60.enc = &(tls->traffic_protection).enc;
  local_60.record_header_length = 5;
  local_60.begin_message = begin_record_message;
  local_60.commit_message = commit_record_message;
  local_38 = 0;
  local_60.buf = _sendbuf;
  if (tls->state == PTLS_STATE_CLIENT_HANDSHAKE_START) {
    if ((input != (void *)0x0) && (*inlen != 0)) {
      __assert_fail("input == NULL || *inlen == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0x12e9,
                    "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
    if (*tls->ctx->key_exchanges == (ptls_key_exchange_algorithm_t *)0x0) {
      __assert_fail("tls->ctx->key_exchanges[0] != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0x12ea,
                    "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
    uVar3 = send_client_hello(tls,&local_60,properties,(ptls_iovec_t *)0x0);
  }
  else {
    sVar2 = _sendbuf->off;
    pvVar1 = (void *)((long)input + *inlen);
    local_88.base = "";
    local_88.capacity = 0;
    local_88.off = 0;
    local_88._24_8_ = local_88._24_8_ & 0xffffffff00000000;
    local_68 = inlen;
    if (*inlen == 0) {
      uVar3 = 0x202;
    }
    else {
      do {
        local_90 = (long)pvVar1 - (long)input;
        uVar3 = handle_input(tls,&local_60,&local_88,input,&local_90,properties);
        if (local_88.off != 0) {
          __assert_fail("decryptbuf.off == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                        ,0x12fc,
                        "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                       );
        }
        input = (void *)((long)input + local_90);
      } while ((uVar3 == 0x202) && (input != pvVar1));
    }
    __ptr = local_88.base;
    (*ptls_clear_memory)(local_88.base,local_88.off);
    if (local_88.is_allocated != 0) {
      free(__ptr);
    }
    local_88.off = 0;
    local_88.is_allocated = 0;
    local_88._28_4_ = 0;
    local_88.base = (uint8_t *)0x0;
    local_88.capacity = 0;
    if (((uVar3 != 0) && (uVar3 != 0x202)) && (uVar3 != 0x206)) {
      (*ptls_clear_memory)((local_60.buf)->base + sVar2,(local_60.buf)->off - sVar2);
      (local_60.buf)->off = sVar2;
      if ((uVar3 & 0xffffff00) != 0x100) {
        description = 'P';
        if ((uVar3 & 0xffffff00) == 0) {
          description = (uint8_t)uVar3;
        }
        iVar4 = ptls_send_alert(tls,local_60.buf,'\x02',description);
        if (iVar4 != 0) {
          (local_60.buf)->off = sVar2;
        }
      }
    }
    *local_68 = (long)input + (*local_68 - (long)pvVar1);
  }
  return uVar3;
}

Assistant:

int ptls_handshake(ptls_t *tls, ptls_buffer_t *_sendbuf, const void *input, size_t *inlen, ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_message_emitter_t emitter;
    int ret;

    assert(tls->state < PTLS_STATE_POST_HANDSHAKE_MIN);

    init_record_message_emitter(tls, &emitter, _sendbuf);
    size_t sendbuf_orig_off = emitter.super.buf->off;

    /* special handlings */
    switch (tls->state) {
    case PTLS_STATE_CLIENT_HANDSHAKE_START: {
        assert(input == NULL || *inlen == 0);
        assert(tls->ctx->key_exchanges[0] != NULL);
        return send_client_hello(tls, &emitter.super, properties, NULL);
    }
    default:
        break;
    }

    const uint8_t *src = input, *const src_end = src + *inlen;
    ptls_buffer_t decryptbuf;

    ptls_buffer_init(&decryptbuf, "", 0);

    /* perform handhake until completion or until all the input has been swallowed */
    ret = PTLS_ERROR_IN_PROGRESS;
    while (ret == PTLS_ERROR_IN_PROGRESS && src != src_end) {
        size_t consumed = src_end - src;
        ret = handle_input(tls, &emitter.super, &decryptbuf, src, &consumed, properties);
        src += consumed;
        assert(decryptbuf.off == 0);
    }

    ptls_buffer_dispose(&decryptbuf);

    switch (ret) {
    case 0:
    case PTLS_ERROR_IN_PROGRESS:
    case PTLS_ERROR_STATELESS_RETRY:
        break;
    default:
        /* flush partially written response */
        ptls_clear_memory(emitter.super.buf->base + sendbuf_orig_off, emitter.super.buf->off - sendbuf_orig_off);
        emitter.super.buf->off = sendbuf_orig_off;
        /* send alert immediately */
        if (PTLS_ERROR_GET_CLASS(ret) != PTLS_ERROR_CLASS_PEER_ALERT)
            if (ptls_send_alert(tls, emitter.super.buf, PTLS_ALERT_LEVEL_FATAL,
                                PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT ? ret : PTLS_ALERT_INTERNAL_ERROR) != 0)
                emitter.super.buf->off = sendbuf_orig_off;
        break;
    }

    *inlen -= src_end - src;
    return ret;
}